

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# halfEdgeMesh.h
# Opt level: O0

void __thiscall CGL::Vertex::computeNormal(Vertex *this)

{
  bool bVar1;
  HalfedgeIter *pHVar2;
  pointer pVVar3;
  Vertex *in_RDI;
  Vector3D pk_1;
  Vector3D pj_1;
  Vector3D pk;
  Vector3D pj;
  HalfedgeCIter h;
  Vector3D pi;
  _List_const_iterator<CGL::Halfedge> in_stack_fffffffffffffdd0;
  HalfedgeCIter in_stack_fffffffffffffdd8;
  Vector3D local_1d8;
  _List_node_base *local_1b0;
  _List_node_base *local_1a8;
  _List_node_base *local_1a0;
  Vector3D local_198;
  _List_node_base *local_178;
  _List_node_base *local_170;
  Vector3D local_168;
  _List_const_iterator<CGL::Halfedge> local_140;
  _List_node_base *local_138;
  _List_node_base *local_130;
  Vector3D local_e8;
  _List_node_base *local_c0;
  _List_node_base *local_b8;
  _List_node_base *local_b0;
  Vector3D local_a8;
  _List_node_base *local_88;
  _List_node_base *local_80;
  Vector3D local_78;
  _List_const_iterator<CGL::Halfedge> local_50;
  Vector3D local_48;
  anon_union_32_3_e2189aaa_for_Vector3D_0 local_28;
  
  Vector3D::Vector3D((Vector3D *)&local_28.field_0,0.0,0.0,0.0);
  (in_RDI->normal).field_0.field_0.x = local_28.field_0.x;
  (in_RDI->normal).field_0.field_0.y = local_28.field_0.y;
  (in_RDI->normal).field_0.field_0.z = local_28.field_0.z;
  *(undefined8 *)((long)&(in_RDI->normal).field_0 + 0x18) = local_28._24_8_;
  Vector3D::Vector3D(&local_48,&in_RDI->position);
  pHVar2 = halfedge(in_RDI);
  std::_List_const_iterator<CGL::Halfedge>::_List_const_iterator(&local_50,pHVar2);
  bVar1 = isBoundary((Vertex *)in_stack_fffffffffffffdd8._M_node);
  if (bVar1) {
    do {
      std::_List_const_iterator<CGL::Halfedge>::operator->
                ((_List_const_iterator<CGL::Halfedge> *)in_stack_fffffffffffffdd0._M_node);
      local_88 = (_List_node_base *)Halfedge::next((Halfedge *)in_RDI);
      std::_List_const_iterator<CGL::Halfedge>::operator->
                ((_List_const_iterator<CGL::Halfedge> *)in_stack_fffffffffffffdd0._M_node);
      local_80 = (_List_node_base *)Halfedge::vertex((Halfedge *)in_RDI);
      pVVar3 = std::_List_const_iterator<CGL::Vertex>::operator->
                         ((_List_const_iterator<CGL::Vertex> *)in_stack_fffffffffffffdd0._M_node);
      Vector3D::Vector3D(&local_78,&pVVar3->position);
      std::_List_const_iterator<CGL::Halfedge>::operator->
                ((_List_const_iterator<CGL::Halfedge> *)in_stack_fffffffffffffdd0._M_node);
      local_c0 = (_List_node_base *)Halfedge::next((Halfedge *)in_RDI);
      std::_List_const_iterator<CGL::Halfedge>::operator->
                ((_List_const_iterator<CGL::Halfedge> *)in_stack_fffffffffffffdd0._M_node);
      local_b8 = (_List_node_base *)Halfedge::next((Halfedge *)in_RDI);
      std::_List_const_iterator<CGL::Halfedge>::operator->
                ((_List_const_iterator<CGL::Halfedge> *)in_stack_fffffffffffffdd0._M_node);
      local_b0 = (_List_node_base *)Halfedge::vertex((Halfedge *)in_RDI);
      pVVar3 = std::_List_const_iterator<CGL::Vertex>::operator->
                         ((_List_const_iterator<CGL::Vertex> *)in_stack_fffffffffffffdd0._M_node);
      Vector3D::Vector3D(&local_a8,&pVVar3->position);
      Vector3D::operator-((Vector3D *)in_stack_fffffffffffffdd0._M_node,(Vector3D *)in_RDI);
      Vector3D::operator-((Vector3D *)in_stack_fffffffffffffdd0._M_node,(Vector3D *)in_RDI);
      cross((Vector3D *)in_stack_fffffffffffffdd8._M_node,
            (Vector3D *)in_stack_fffffffffffffdd0._M_node);
      Vector3D::operator+=(&in_RDI->normal,&local_e8);
      std::_List_const_iterator<CGL::Halfedge>::operator->
                ((_List_const_iterator<CGL::Halfedge> *)in_stack_fffffffffffffdd0._M_node);
      local_138 = (_List_node_base *)Halfedge::next((Halfedge *)in_RDI);
      std::_List_const_iterator<CGL::Halfedge>::operator->
                ((_List_const_iterator<CGL::Halfedge> *)in_stack_fffffffffffffdd0._M_node);
      local_130 = (_List_node_base *)Halfedge::twin((Halfedge *)in_RDI);
      local_50._M_node = local_130;
      pHVar2 = halfedge(in_RDI);
      std::_List_const_iterator<CGL::Halfedge>::_List_const_iterator(&local_140,pHVar2);
      bVar1 = std::operator!=(&local_50,&local_140);
    } while (bVar1);
  }
  else {
    do {
      std::_List_const_iterator<CGL::Halfedge>::operator->
                ((_List_const_iterator<CGL::Halfedge> *)in_stack_fffffffffffffdd0._M_node);
      local_178 = (_List_node_base *)Halfedge::next((Halfedge *)in_RDI);
      std::_List_const_iterator<CGL::Halfedge>::operator->
                ((_List_const_iterator<CGL::Halfedge> *)in_stack_fffffffffffffdd0._M_node);
      local_170 = (_List_node_base *)Halfedge::vertex((Halfedge *)in_RDI);
      pVVar3 = std::_List_const_iterator<CGL::Vertex>::operator->
                         ((_List_const_iterator<CGL::Vertex> *)in_stack_fffffffffffffdd0._M_node);
      Vector3D::Vector3D(&local_168,&pVVar3->position);
      std::_List_const_iterator<CGL::Halfedge>::operator->
                ((_List_const_iterator<CGL::Halfedge> *)in_stack_fffffffffffffdd0._M_node);
      local_1b0 = (_List_node_base *)Halfedge::next((Halfedge *)in_RDI);
      std::_List_const_iterator<CGL::Halfedge>::operator->
                ((_List_const_iterator<CGL::Halfedge> *)in_stack_fffffffffffffdd0._M_node);
      local_1a8 = (_List_node_base *)Halfedge::next((Halfedge *)in_RDI);
      std::_List_const_iterator<CGL::Halfedge>::operator->
                ((_List_const_iterator<CGL::Halfedge> *)in_stack_fffffffffffffdd0._M_node);
      local_1a0 = (_List_node_base *)Halfedge::vertex((Halfedge *)in_RDI);
      pVVar3 = std::_List_const_iterator<CGL::Vertex>::operator->
                         ((_List_const_iterator<CGL::Vertex> *)in_stack_fffffffffffffdd0._M_node);
      Vector3D::Vector3D(&local_198,&pVVar3->position);
      Vector3D::operator-((Vector3D *)in_stack_fffffffffffffdd0._M_node,(Vector3D *)in_RDI);
      Vector3D::operator-((Vector3D *)in_stack_fffffffffffffdd0._M_node,(Vector3D *)in_RDI);
      cross((Vector3D *)in_stack_fffffffffffffdd8._M_node,
            (Vector3D *)in_stack_fffffffffffffdd0._M_node);
      Vector3D::operator+=(&in_RDI->normal,&local_1d8);
      std::_List_const_iterator<CGL::Halfedge>::operator->
                ((_List_const_iterator<CGL::Halfedge> *)in_stack_fffffffffffffdd0._M_node);
      in_stack_fffffffffffffdd8 = Halfedge::twin((Halfedge *)in_RDI);
      std::_List_const_iterator<CGL::Halfedge>::operator->
                ((_List_const_iterator<CGL::Halfedge> *)in_stack_fffffffffffffdd0._M_node);
      local_50._M_node = (_List_node_base *)Halfedge::next((Halfedge *)in_RDI);
      pHVar2 = halfedge(in_RDI);
      std::_List_const_iterator<CGL::Halfedge>::_List_const_iterator
                ((_List_const_iterator<CGL::Halfedge> *)&stack0xfffffffffffffdd0,pHVar2);
      bVar1 = std::operator!=(&local_50,(_Self *)&stack0xfffffffffffffdd0);
    } while (bVar1);
  }
  Vector3D::normalize((Vector3D *)in_stack_fffffffffffffdd0._M_node);
  return;
}

Assistant:

void computeNormal(void) {
    normal = Vector3D( 0., 0., 0. );
    Vector3D pi = position;

    // Iterate over neighbors.
    HalfedgeCIter h = halfedge();
    if (isBoundary()) {
      do {
         Vector3D pj = h->next()->vertex()->position;
         Vector3D pk = h->next()->next()->vertex()->position;
         normal += cross( pj-pi, pk-pi );
         h = h->next()->twin();
      } while( h != halfedge() );      
    } else {
      do {
         Vector3D pj = h->next()->vertex()->position;
         Vector3D pk = h->next()->next()->vertex()->position;
         normal += cross( pj-pi, pk-pi );
         h = h->twin()->next();
      } while( h != halfedge() );
    }

    normal.normalize();
  }